

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::GetComponentTypeOfArrayMatrix
                   (DefUseManager *def_use_mgr,uint32_t type_id,uint32_t depth_to_component)

{
  Op OVar1;
  uint32_t uVar2;
  Instruction *this;
  uint32_t column_type_id;
  uint32_t elem_type_id;
  Instruction *type_inst;
  uint32_t depth_to_component_local;
  uint32_t type_id_local;
  DefUseManager *def_use_mgr_local;
  
  def_use_mgr_local._4_4_ = type_id;
  if (depth_to_component != 0) {
    this = analysis::DefUseManager::GetDef(def_use_mgr,type_id);
    OVar1 = opt::Instruction::opcode(this);
    if (OVar1 == OpTypeArray) {
      uVar2 = opt::Instruction::GetSingleWordInOperand(this,0);
      def_use_mgr_local._4_4_ =
           GetComponentTypeOfArrayMatrix(def_use_mgr,uVar2,depth_to_component - 1);
    }
    else {
      OVar1 = opt::Instruction::opcode(this);
      if (OVar1 != OpTypeMatrix) {
        __assert_fail("type_inst->opcode() == spv::Op::OpTypeMatrix",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                      ,0x56,
                      "uint32_t spvtools::opt::(anonymous namespace)::GetComponentTypeOfArrayMatrix(analysis::DefUseManager *, uint32_t, uint32_t)"
                     );
      }
      uVar2 = opt::Instruction::GetSingleWordInOperand(this,0);
      def_use_mgr_local._4_4_ =
           GetComponentTypeOfArrayMatrix(def_use_mgr,uVar2,depth_to_component - 1);
    }
  }
  return def_use_mgr_local._4_4_;
}

Assistant:

uint32_t GetComponentTypeOfArrayMatrix(analysis::DefUseManager* def_use_mgr,
                                       uint32_t type_id,
                                       uint32_t depth_to_component) {
  if (depth_to_component == 0) return type_id;

  Instruction* type_inst = def_use_mgr->GetDef(type_id);
  if (type_inst->opcode() == spv::Op::OpTypeArray) {
    uint32_t elem_type_id =
        type_inst->GetSingleWordInOperand(kOpTypeArrayElemTypeInOperandIndex);
    return GetComponentTypeOfArrayMatrix(def_use_mgr, elem_type_id,
                                         depth_to_component - 1);
  }

  assert(type_inst->opcode() == spv::Op::OpTypeMatrix);
  uint32_t column_type_id =
      type_inst->GetSingleWordInOperand(kOpTypeMatrixColTypeInOperandIndex);
  return GetComponentTypeOfArrayMatrix(def_use_mgr, column_type_id,
                                       depth_to_component - 1);
}